

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuckinghamInteractionType.hpp
# Opt level: O1

void __thiscall
OpenMD::BuckinghamInteractionType::BuckinghamInteractionType
          (BuckinghamInteractionType *this,RealType myA,RealType myB,RealType myC,
          BuckinghamType myType)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002fde78;
  this->A = myA;
  this->B = myB;
  this->C = myC;
  this->interactionType = myType;
  NonBondedInteractionType::setBuckingham(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

BuckinghamInteractionType(RealType myA, RealType myB, RealType myC,
                              BuckinghamType myType) {
      A               = myA;
      B               = myB;
      C               = myC;
      interactionType = myType;
      setBuckingham();
    }